

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_compress_fast_continue
              (LZ4_stream_t *LZ4_stream,char *source,char *dest,int inputSize,int maxOutputSize,
              int acceleration)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  LZ4_byte *pLVar4;
  uint uVar5;
  LZ4_byte *pLVar6;
  dict_directive dictDirective;
  dictIssue_directive dVar7;
  
  if ((ulong)(LZ4_stream->internal_donotuse).dictSize == 0) {
    pLVar6 = (LZ4_byte *)0x0;
  }
  else {
    pLVar6 = (LZ4_stream->internal_donotuse).dictionary + (LZ4_stream->internal_donotuse).dictSize;
  }
  LZ4_renormDictT(&LZ4_stream->internal_donotuse,inputSize);
  iVar1 = 1;
  if (1 < acceleration) {
    iVar1 = acceleration;
  }
  if (0x10000 < iVar1) {
    iVar1 = 0x10001;
  }
  uVar2 = (ulong)(LZ4_stream->internal_donotuse).dictSize;
  if (((((LZ4_stream->internal_donotuse).dictSize < 4) && (0 < inputSize)) &&
      (pLVar6 != (LZ4_byte *)source)) &&
     ((LZ4_stream->internal_donotuse).dictCtx == (LZ4_stream_t_internal *)0x0)) {
    (LZ4_stream->internal_donotuse).dictSize = 0;
    (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
    uVar2 = 0;
    pLVar6 = (LZ4_byte *)source;
  }
  pLVar4 = (LZ4_byte *)(source + inputSize);
  if (((LZ4_stream->internal_donotuse).dictionary < pLVar4) && (pLVar4 < pLVar6)) {
    uVar5 = (int)pLVar6 - (int)pLVar4;
    uVar3 = 0x10000;
    if (uVar5 < 0x10000) {
      uVar3 = uVar5;
    }
    uVar2 = 0;
    if (3 < uVar5) {
      uVar2 = (ulong)uVar3;
    }
    (LZ4_stream->internal_donotuse).dictSize = (LZ4_u32)uVar2;
    (LZ4_stream->internal_donotuse).dictionary = pLVar6 + -uVar2;
  }
  uVar3 = (uint)uVar2;
  if (pLVar6 == (LZ4_byte *)source) {
    if ((uVar3 < 0x10000) && (uVar3 < (LZ4_stream->internal_donotuse).currentOffset)) {
      dVar7 = dictSmall;
    }
    else {
      dVar7 = noDictIssue;
    }
    iVar1 = LZ4_compress_generic
                      (&LZ4_stream->internal_donotuse,source,dest,inputSize,(int *)0x0,maxOutputSize
                       ,limitedOutput,byU32,withPrefix64k,dVar7,iVar1);
    return iVar1;
  }
  if ((LZ4_stream->internal_donotuse).dictCtx == (LZ4_stream_t_internal *)0x0) {
    if ((uVar3 < 0x10000) && (uVar3 < (LZ4_stream->internal_donotuse).currentOffset)) {
      dVar7 = dictSmall;
      dictDirective = usingExtDict;
      goto LAB_002e5098;
    }
LAB_002e5051:
    dictDirective = usingExtDict;
  }
  else {
    if (0x1000 < inputSize) {
      switchD_00332694::default(LZ4_stream,(LZ4_stream->internal_donotuse).dictCtx,0x4020);
      goto LAB_002e5051;
    }
    dictDirective = usingDictCtx;
  }
  dVar7 = noDictIssue;
LAB_002e5098:
  iVar1 = LZ4_compress_generic
                    (&LZ4_stream->internal_donotuse,source,dest,inputSize,(int *)0x0,maxOutputSize,
                     limitedOutput,byU32,dictDirective,dVar7,iVar1);
  (LZ4_stream->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_stream->internal_donotuse).dictSize = inputSize;
  return iVar1;
}

Assistant:

int LZ4_compress_fast_continue (LZ4_stream_t* LZ4_stream,
                                const char* source, char* dest,
                                int inputSize, int maxOutputSize,
                                int acceleration)
{
    const tableType_t tableType = byU32;
    LZ4_stream_t_internal* const streamPtr = &LZ4_stream->internal_donotuse;
    const char* dictEnd = streamPtr->dictSize ? (const char*)streamPtr->dictionary + streamPtr->dictSize : NULL;

    DEBUGLOG(5, "LZ4_compress_fast_continue (inputSize=%i, dictSize=%u)", inputSize, streamPtr->dictSize);

    LZ4_renormDictT(streamPtr, inputSize);   /* fix index overflow */
    if (acceleration < 1) acceleration = LZ4_ACCELERATION_DEFAULT;
    if (acceleration > LZ4_ACCELERATION_MAX) acceleration = LZ4_ACCELERATION_MAX;

    /* invalidate tiny dictionaries */
    if ( (streamPtr->dictSize < 4)     /* tiny dictionary : not enough for a hash */
      && (dictEnd != source)           /* prefix mode */
      && (inputSize > 0)               /* tolerance : don't lose history, in case next invocation would use prefix mode */
      && (streamPtr->dictCtx == NULL)  /* usingDictCtx */
      ) {
        DEBUGLOG(5, "LZ4_compress_fast_continue: dictSize(%u) at addr:%p is too small", streamPtr->dictSize, streamPtr->dictionary);
        /* remove dictionary existence from history, to employ faster prefix mode */
        streamPtr->dictSize = 0;
        streamPtr->dictionary = (const BYTE*)source;
        dictEnd = source;
    }

    /* Check overlapping input/dictionary space */
    {   const char* const sourceEnd = source + inputSize;
        if ((sourceEnd > (const char*)streamPtr->dictionary) && (sourceEnd < dictEnd)) {
            streamPtr->dictSize = (U32)(dictEnd - sourceEnd);
            if (streamPtr->dictSize > 64 KB) streamPtr->dictSize = 64 KB;
            if (streamPtr->dictSize < 4) streamPtr->dictSize = 0;
            streamPtr->dictionary = (const BYTE*)dictEnd - streamPtr->dictSize;
        }
    }

    /* prefix mode : source data follows dictionary */
    if (dictEnd == source) {
        if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset))
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, dictSmall, acceleration);
        else
            return LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, withPrefix64k, noDictIssue, acceleration);
    }

    /* external dictionary mode */
    {   int result;
        if (streamPtr->dictCtx) {
            /* We depend here on the fact that dictCtx'es (produced by
             * LZ4_loadDict) guarantee that their tables contain no references
             * to offsets between dictCtx->currentOffset - 64 KB and
             * dictCtx->currentOffset - dictCtx->dictSize. This makes it safe
             * to use noDictIssue even when the dict isn't a full 64 KB.
             */
            if (inputSize > 4 KB) {
                /* For compressing large blobs, it is faster to pay the setup
                 * cost to copy the dictionary's tables into the active context,
                 * so that the compression loop is only looking into one table.
                 */
                LZ4_memcpy(streamPtr, streamPtr->dictCtx, sizeof(*streamPtr));
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingDictCtx, noDictIssue, acceleration);
            }
        } else {  /* small data <= 4 KB */
            if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, dictSmall, acceleration);
            } else {
                result = LZ4_compress_generic(streamPtr, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, usingExtDict, noDictIssue, acceleration);
            }
        }
        streamPtr->dictionary = (const BYTE*)source;
        streamPtr->dictSize = (U32)inputSize;
        return result;
    }
}